

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed)

{
  cmRuntimeDependencyArchive *this_00;
  string *psVar1;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *this_01;
  bool bVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  cmUVProcessChain process;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  ostringstream e;
  cmUVProcessChainBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string *local_208;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *local_200;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1f8;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
  local_1f0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [4];
  char *local_188;
  char *local_180;
  ios_base local_168 [48];
  char *local_138;
  cmUVProcessChainBuilder local_60;
  
  local_1f8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)needed;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_60);
  cmUVProcessChainBuilder::SetBuiltinStream(&local_60,Stream_OUTPUT);
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool).Archive;
  local_1d8._0_8_ = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"objdump","");
  bVar2 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)local_1d8,&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != local_1c8) {
    operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
  }
  if (bVar2) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
               (char (*) [3])"-p");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_228,file);
    cmUVProcessChainBuilder::AddCommand(&local_60,&local_228);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_250);
    bVar2 = cmUVProcessChain::Valid((cmUVProcessChain *)local_250);
    if (bVar2) {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_string_length._0_4_ = None;
      local_248._M_string_length._4_4_ = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      local_208 = file;
      local_200 = &this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool;
      if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::regex == '\0') {
        iVar4 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex);
        if (iVar4 != 0) {
          GetFileInfo::regex.regmatch.startp[0] = (char *)0x0;
          GetFileInfo::regex.regmatch.endp[0] = (char *)0x0;
          GetFileInfo::regex.regmatch.searchstring = (char *)0x0;
          GetFileInfo::regex.program = (char *)0x0;
          cmsys::RegularExpression::compile
                    (&GetFileInfo::regex,"^\t*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])\r$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::regex,
                       &__dso_handle);
          __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::regex);
        }
      }
      while( true ) {
        piVar5 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_250);
        cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar5 + -0x18) + (char)piVar5);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (piVar5,(string *)(local_250 + 8),cVar3);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        local_1d8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_188 = (char *)0x0;
        local_138 = (char *)0x0;
        bVar2 = cmsys::RegularExpression::find
                          (&GetFileInfo::regex,local_248._M_dataplus._M_p,
                           (RegularExpressionMatch *)local_1d8);
        if (bVar2) {
          if ((char *)local_1d8._8_8_ == (char *)0x0) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            local_270._M_string_length = 0;
            local_270.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,local_1d8._8_8_,local_180);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_1f8,&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                     local_270.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      bVar2 = cmUVProcessChain::Wait((cmUVProcessChain *)local_250,-1);
      this_01 = local_200;
      psVar1 = local_208;
      if (bVar2) {
        cmUVProcessChain::GetStatus(&local_1f0,(cmUVProcessChain *)local_250);
        if ((*local_1f0.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start == (Status *)0x0) ||
           ((*local_1f0.
              super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
              ._M_impl.super__Vector_impl_data._M_start)->ExitStatus != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,"Failed to run objdump on:\n  ",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,
                            CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                     local_270.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
          std::ios_base::~ios_base(local_168);
          bVar2 = false;
        }
        else {
          bVar2 = true;
        }
        if (local_1f0.
            super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f0.
                          super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f0.
                                super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.
                                super__Vector_base<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"Failed to wait on objdump process for:\n  ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
        std::__cxx11::stringbuf::str();
        cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError(this_01,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                                   local_270.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Failed to start objdump process for:\n  ",0x27);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::__cxx11::stringbuf::str();
      cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,
                 (string *)(local_250 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      std::ios_base::~ios_base(local_168);
      bVar2 = false;
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_250);
  }
  else {
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Could not find objdump","")
    ;
    cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8[0]._M_allocated_capacity + 1);
    }
    bVar2 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_60.Processes);
  return bVar2;
}

Assistant:

bool cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo(
  const std::string& file, std::vector<std::string>& needed)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("objdump", command)) {
    this->SetError("Could not find objdump");
    return false;
  }
  command.emplace_back("-p");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid()) {
    std::ostringstream e;
    e << "Failed to start objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex(
    "^\t*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])\r$");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run objdump on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}